

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O2

int forkfd(int flags,pid_t *ppid)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((flags & 4U) == 0) {
    iVar1 = system_forkfd_availability();
    if (-1 < iVar1) {
      local_24 = -0x55555556;
      lVar2 = syscall(0x38,0x1011,0,&local_24,0,0);
      iVar1 = local_24;
      iVar3 = (int)lVar2;
      if (-1 < iVar3) {
        if (ppid != (pid_t *)0x0) {
          *ppid = iVar3;
        }
        if (iVar3 == 0) {
          iVar3 = -2;
        }
        else {
          system_forkfd_pidfd_set_flags(local_24,flags);
          iVar3 = iVar1;
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return iVar3;
      }
      goto LAB_003e5c1f;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    iVar1 = forkfd_fork_fallback(flags,ppid);
    return iVar1;
  }
LAB_003e5c1f:
  __stack_chk_fail();
}

Assistant:

int forkfd(int flags, pid_t *ppid)
{
    int fd;
    if (disable_fork_fallback())
        flags &= ~FFD_USE_FORK;

    if ((flags & FFD_USE_FORK) == 0) {
        int system_forkfd_works;
        fd = system_forkfd(flags, ppid, &system_forkfd_works);
        if (system_forkfd_works || disable_fork_fallback())
            return fd;
    }

    return forkfd_fork_fallback(flags, ppid);
}